

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O3

FT_Error tt_face_goto_table(TT_Face face,FT_ULong tag,FT_Stream stream,FT_ULong *length)

{
  FT_Error FVar1;
  TT_Table pTVar2;
  TT_Table pTVar3;
  
  if (face->num_tables != 0) {
    pTVar2 = face->dir_tables;
    pTVar3 = pTVar2 + face->num_tables;
    do {
      if ((pTVar2->Tag == tag) && (pTVar2->Length != 0)) {
        if (length != (FT_ULong *)0x0) {
          *length = pTVar2->Length;
        }
        FVar1 = FT_Stream_Seek(stream,pTVar2->Offset);
        return FVar1;
      }
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 < pTVar3);
  }
  return 0x8e;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_goto_table( TT_Face    face,
                      FT_ULong   tag,
                      FT_Stream  stream,
                      FT_ULong*  length )
  {
    TT_Table  table;
    FT_Error  error;


    table = tt_face_lookup_table( face, tag );
    if ( table )
    {
      if ( length )
        *length = table->Length;

      if ( FT_STREAM_SEEK( table->Offset ) )
        goto Exit;
    }
    else
      error = FT_THROW( Table_Missing );

  Exit:
    return error;
  }